

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this,
               VkImageCreateInfo *imageRSInfo,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  size_type sVar2;
  allocator<char> local_e1;
  string local_e0;
  undefined4 local_c0;
  allocator<char> local_b9;
  string local_b8;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_98;
  Vector<int,_4> *local_90;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_88;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_80 [3];
  undefined1 local_64 [8];
  IVec4 pixel;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> distinctValues;
  deUint32 distinctValuesExpected;
  ConstPixelBufferAccess *dataRS_local;
  VkImageCreateInfo *imageRSInfo_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this_local;
  
  distinctValues.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_MSInstanceBaseResolve).super_MultisampleInstanceBase.m_imageMSParams.numSamples
       + VK_SAMPLE_COUNT_1_BIT;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&y);
  for (x = 0; x < (imageRSInfo->extent).depth; x = x + 1) {
    for (pixel.m_data[3] = 0; (uint)pixel.m_data[3] < (imageRSInfo->extent).height;
        pixel.m_data[3] = pixel.m_data[3] + 1) {
      for (pixel.m_data[2] = 0; (uint)pixel.m_data[2] < (imageRSInfo->extent).width;
          pixel.m_data[2] = pixel.m_data[2] + 1) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_64,(int)dataRS,pixel.m_data[2],pixel.m_data[3]);
        local_88._M_current =
             (Vector<int,_4> *)
             std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::begin
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&y);
        local_90 = (Vector<int,_4> *)
                   std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::end
                             ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                              &y);
        local_80[0] = std::
                      find<__gnu_cxx::__normal_iterator<tcu::Vector<int,4>*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>,tcu::Vector<int,4>>
                                (local_88,(__normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
                                           )local_90,(Vector<int,_4> *)local_64);
        local_98._M_current =
             (Vector<int,_4> *)
             std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::end
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&y);
        bVar1 = __gnu_cxx::operator==(local_80,&local_98);
        if (bVar1) {
          std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
                    ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&y,
                     (value_type *)local_64);
        }
      }
    }
  }
  sVar2 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                    ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&y);
  if (sVar2 < distinctValues.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Expected numSamples+1 different colors in the output image",
               &local_e1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Passed",&local_b9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  local_c0 = 1;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&y);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceDistinctValues>::verifyImageData (const vk::VkImageCreateInfo& imageRSInfo, const tcu::ConstPixelBufferAccess& dataRS) const
{
	const deUint32 distinctValuesExpected = static_cast<deUint32>(m_imageMSParams.numSamples) + 1u;

	std::vector<tcu::IVec4> distinctValues;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;	 ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;	 ++x)
	{
		const tcu::IVec4 pixel = dataRS.getPixelInt(x, y, z);

		if (std::find(distinctValues.begin(), distinctValues.end(), pixel) == distinctValues.end())
			distinctValues.push_back(pixel);
	}

	if (distinctValues.size() >= distinctValuesExpected)
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Expected numSamples+1 different colors in the output image");
}